

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementCableANCF::LoadableGetStateBlock_x
          (ChElementCableANCF *this,int block_offset,ChState *mD)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_78;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyz + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)block_offset,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((((this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->super_ChNodeFEAxyz + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 3),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyz + 0x20);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 6),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  local_78.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           ((long)&((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeFEAxyz + 0xf0);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 9),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_78);
  return;
}

Assistant:

void ChElementCableANCF::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = nodes[0]->GetD().eigen();
    mD.segment(block_offset + 6, 3) = nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 9, 3) = nodes[1]->GetD().eigen();
}